

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_neg_enum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x6e65673200000000) {
    if ((uVar1 & 0xffffffff00000000) != 0x6e65673100000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0xfffffffffffffff4;
    *value_sign = 1;
  }
  else if ((uVar1 & 0xffffffff00000000) == 0x6e65673300000000) {
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0xfffffffffffffff6;
    *value_sign = 1;
  }
  else {
    if ((uVar1 & 0xffffffff00000000) != 0x6e65673200000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0xfffffffffffffff5;
    *value_sign = 1;
  }
  return end_local;
}

Assistant:

static const char *MyGame_Example_neg_enum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x6e65673200000000) { /* branch "neg2" */
        if ((w & 0xffffffff00000000) == 0x6e65673100000000) { /* "neg1" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(18446744073709551604), *value_sign = 1;
            } else {
                return unmatched;
            }
        } else { /* "neg1" */
            return unmatched;
        } /* "neg1" */
    } else { /* branch "neg2" */
        if ((w & 0xffffffff00000000) == 0x6e65673300000000) { /* "neg3" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(18446744073709551606), *value_sign = 1;
            } else {
                return unmatched;
            }
        } else { /* "neg3" */
            if ((w & 0xffffffff00000000) == 0x6e65673200000000) { /* "neg2" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(18446744073709551605), *value_sign = 1;
                } else {
                    return unmatched;
                }
            } else { /* "neg2" */
                return unmatched;
            } /* "neg2" */
        } /* "neg3" */
    } /* branch "neg2" */
    return buf;
}